

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square_tm.cpp
# Opt level: O2

void calc<float>(options2f *opt)

{
  string *__lhs;
  long lVar1;
  bool bVar2;
  ostream *poVar3;
  invalid_argument *this;
  float Jx;
  float Jy;
  float fVar4;
  float fVar5;
  float beta;
  float fVar6;
  real_t b0;
  result_t f;
  
  Jx = convert<float>(&opt->Jx);
  Jy = convert<float>(&opt->Jy);
  __lhs = &opt->Tmin;
  bVar2 = std::operator==(__lhs,"tc");
  if (!bVar2) {
    bVar2 = std::operator==(__lhs,"Tc");
    if (!bVar2) {
      fVar6 = convert<float>(__lhs);
      fVar5 = convert<float>(&opt->Tmax);
      fVar4 = convert<float>(&opt->dT);
      goto LAB_00103d5f;
    }
  }
  fVar4 = ising::tc::square<float>(Jx,Jy);
  fVar5 = fVar4;
  fVar6 = fVar4;
LAB_00103d5f:
  lVar1 = std::cout;
  if ((fVar5 < 0.0) || (fVar6 < 0.0)) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Temperature should be positive");
  }
  else if (fVar5 < fVar6) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Tmax should be larger than Tmin");
  }
  else {
    if (0.0 < fVar4) {
      *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::runtime_error::runtime_error + *(long *)(std::cout + -0x18)) & 0xfffffefb
           | 0x100;
      *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) = 6;
      poVar3 = std::operator<<((ostream *)&std::cout,"# lattice: square\n");
      poVar3 = std::operator<<(poVar3,"# precision: ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,6);
      poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
      std::operator<<(poVar3,"# Lx Ly Jx Jy T 1/T F/N E/N C/N M2/N2\n");
      for (; fVar6 < fVar4 * 0.0001 + fVar5; fVar6 = fVar6 + fVar4) {
        beta = 1.0 / fVar6;
        ising::free_energy::square::transfer_matrix<float>::calc(&f,opt->Lx,opt->Ly,Jx,Jy,beta,0.0);
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        poVar3 = std::operator<<(poVar3,' ');
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        poVar3 = std::operator<<(poVar3,' ');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,Jx);
        poVar3 = std::operator<<(poVar3,' ');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,Jy);
        poVar3 = std::operator<<(poVar3,' ');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,fVar6);
        poVar3 = std::operator<<(poVar3,' ');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,beta);
        poVar3 = std::operator<<(poVar3,' ');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,f.derivatives_[0][0]);
        poVar3 = std::operator<<(poVar3,' ');
        poVar3 = (ostream *)
                 std::ostream::operator<<(poVar3,f.derivatives_[1][0] * beta + f.derivatives_[0][0])
        ;
        poVar3 = std::operator<<(poVar3,' ');
        poVar3 = (ostream *)
                 std::ostream::operator<<
                           (poVar3,-beta * beta *
                                   (f.derivatives_[1][0] + f.derivatives_[1][0] +
                                   f.derivatives_[2][0] * beta));
        poVar3 = std::operator<<(poVar3,' ');
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,-f.derivatives_[0][2] / beta);
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      return;
    }
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"dT should be positive");
  }
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void calc(const options2f& opt) {
  typedef T real_t;
  real_t Jx = convert<real_t>(opt.Jx);
  real_t Jy = convert<real_t>(opt.Jy);
  real_t Tmin, Tmax, dT;
  if (opt.Tmin == "tc" || opt.Tmin == "Tc") {
    Tmin = Tmax = dT = ising::tc::square(Jx, Jy);
  } else {
    Tmin = convert<real_t>(opt.Tmin);
    Tmax = convert<real_t>(opt.Tmax);
    dT = convert<real_t>(opt.dT);
  }
  if (Tmin < 0 || Tmax < 0)
    throw(std::invalid_argument("Temperature should be positive"));
  if (Tmin > Tmax)
    throw(std::invalid_argument("Tmax should be larger than Tmin"));
  if (dT <= 0)
    throw(std::invalid_argument("dT should be positive"));
  std::cout << std::scientific
            << std::setprecision(std::numeric_limits<real_t>::digits10)
            << "# lattice: square\n"
            << "# precision: " << std::numeric_limits<real_t>::digits10
            << std::endl
            << "# Lx Ly Jx Jy T 1/T F/N E/N C/N M2/N2\n";
  for (auto t = Tmin; t < Tmax + 1e-4 * dT; t += dT) {
    real_t h = 0;
    auto f =
        square::transfer_matrix<real_t>::calc(opt.Lx, opt.Ly, Jx, Jy, 1 / t, h);
    typename square::transfer_matrix<real_t>::result_t beta;
    beta.set(0, 1 / t);
    std::cout << opt.Lx << ' ' << opt.Ly << ' ' << Jx << ' ' << Jy << ' ' << t
              << ' ' << (1 / t) << ' ' << free_energy(f, beta, h) << ' '
              << energy(f, beta, h) << ' ' << specific_heat(f, beta, h) << ' '
              << magnetization2(f, beta, h) << std::endl;
  }
}